

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ObjPrintVerbose(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  char *pcVar4;
  Ivy_Obj_t *pIVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                  ,0x279,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  printf("Node %5d : ",(ulong)(uint)pObj->Id);
  if (pObj->Id == 0) {
    pcVar3 = "constant 1";
    goto LAB_0064fb56;
  }
  switch(*(uint *)&pObj->field_0x8 & 0xf) {
  case 1:
    pcVar3 = "PI";
    break;
  case 2:
    pcVar3 = "PO";
    break;
  default:
    pcVar4 = "\'";
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      pcVar4 = " ";
    }
    printf("AND( %5d%s, %5d%s )",(ulong)*(uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pcVar3,
           (ulong)*(uint *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pcVar4);
    goto LAB_0064fbd7;
  case 4:
    uVar1 = *(uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    pcVar4 = "latch (%d%s)";
    goto LAB_0064fb87;
  case 7:
    uVar1 = *(uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    pcVar4 = "buffer (%d%s)";
LAB_0064fb87:
    printf(pcVar4,(ulong)uVar1,pcVar3);
    goto LAB_0064fbd7;
  }
LAB_0064fb56:
  printf(pcVar3);
LAB_0064fbd7:
  printf(" (refs = %3d)",(ulong)(uint)pObj->nRefs);
  pIVar5 = pObj->pEquiv;
  if (fHaig == 0) {
    if (pIVar5 != (Ivy_Obj_t *)0x0) {
      pcVar3 = "\'";
      if (((ulong)pIVar5 & 1) == 0) {
        pcVar3 = " ";
      }
      printf(" HAIG node = %d%s",(ulong)*(uint *)((ulong)pIVar5 & 0xfffffffffffffffe),pcVar3);
      return;
    }
    pcVar3 = " HAIG node not given";
  }
  else {
    if (pIVar5 == (Ivy_Obj_t *)0x0) {
      return;
    }
    if (pObj->nRefs < 1) {
      while( true ) {
        puVar2 = (uint *)((ulong)pIVar5 & 0xfffffffffffffffe);
        if (puVar2[3] != 0) break;
        pIVar5 = *(Ivy_Obj_t **)(puVar2 + 0x12);
      }
      if (0 < (int)puVar2[3]) {
        printf("  class of %d",(ulong)*puVar2);
        return;
      }
      __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                    ,699,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    printf("  { %5d ",(ulong)(uint)pObj->Id);
    pIVar5 = pObj->pEquiv;
    if (((ulong)pIVar5 & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                    ,0x2b3,"void Ivy_ObjPrintVerbose(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    for (; pIVar5 != pObj; pIVar5 = (Ivy_Obj_t *)((ulong)pIVar5->pEquiv & 0xfffffffffffffffe)) {
      pcVar3 = "\'";
      if (((ulong)pIVar5->pEquiv & 1) == 0) {
        pcVar3 = " ";
      }
      printf(" %5d%s",(ulong)(uint)pIVar5->Id,pcVar3);
    }
    pcVar3 = " }";
  }
  printf(pcVar3);
  return;
}

Assistant:

void Ivy_ObjPrintVerbose( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fHaig )
{
    Ivy_Obj_t * pTemp;
    int fShowFanouts = 0;
    assert( !Ivy_IsComplement(pObj) );
    printf( "Node %5d : ", Ivy_ObjId(pObj) );
    if ( Ivy_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Ivy_ObjIsPi(pObj) )
        printf( "PI" );
    else if ( Ivy_ObjIsPo(pObj) )
        printf( "PO" );
    else if ( Ivy_ObjIsLatch(pObj) )
        printf( "latch (%d%s)", Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Ivy_ObjIsBuf(pObj) )
        printf( "buffer (%d%s)", Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %5d%s, %5d%s )", 
            Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " "), 
            Ivy_ObjFanin1(pObj)->Id, (Ivy_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Ivy_ObjRefs(pObj) );
    if ( fShowFanouts )
    {
        Vec_Ptr_t * vFanouts;
        Ivy_Obj_t * pFanout;
        int i;
        vFanouts = Vec_PtrAlloc( 10 );
        printf( "\nFanouts:\n" );
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
        {
            printf( "    " );
            printf( "Node %5d : ", Ivy_ObjId(pFanout) );
            if ( Ivy_ObjIsPo(pFanout) )
                printf( "PO" );
            else if ( Ivy_ObjIsLatch(pFanout) )
                printf( "latch (%d%s)", Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Ivy_ObjIsBuf(pFanout) )
                printf( "buffer (%d%s)", Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %5d%s, %5d%s )", 
                    Ivy_ObjFanin0(pFanout)->Id, (Ivy_ObjFaninC0(pFanout)? "\'" : " "), 
                    Ivy_ObjFanin1(pFanout)->Id, (Ivy_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        Vec_PtrFree( vFanouts );
        return;
    }
    if ( !fHaig )
    {
        if ( pObj->pEquiv == NULL )
            printf( " HAIG node not given" );
        else
            printf( " HAIG node = %d%s", Ivy_Regular(pObj->pEquiv)->Id, (Ivy_IsComplement(pObj->pEquiv)? "\'" : " ") );
        return;
    }
    if ( pObj->pEquiv == NULL )
        return;
    // there are choices
    if ( Ivy_ObjRefs(pObj) > 0 )
    {
        // print equivalence class
        printf( "  { %5d ", pObj->Id );
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            printf( " %5d%s", pTemp->Id, (Ivy_IsComplement(pTemp->pEquiv)? "\'" : " ") );
        printf( " }" );
        return;
    }
    // this is a secondary node
    for ( pTemp = Ivy_Regular(pObj->pEquiv); Ivy_ObjRefs(pTemp) == 0; pTemp = Ivy_Regular(pTemp->pEquiv) );
    assert( Ivy_ObjRefs(pTemp) > 0 );
    printf( "  class of %d", pTemp->Id );
}